

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O1

void google::protobuf::internal::OnShutdown(_func_void *func)

{
  iterator __position;
  vector<void(*)(),std::allocator<void(*)()>> *pvVar1;
  Mutex *this;
  _func_void *in_RDI;
  _func_void *local_30;
  FunctionClosure0 local_28;
  
  local_30 = in_RDI;
  if (shutdown_functions_init != 2) {
    local_28.super_Closure._vptr_Closure = (_func_int **)&PTR__FunctionClosure0_0072ead0;
    local_28.function_ = InitShutdownFunctions;
    local_28.self_deleting_ = false;
    GoogleOnceInitImpl(&shutdown_functions_init,&local_28.super_Closure);
    FunctionClosure0::~FunctionClosure0(&local_28);
  }
  this = shutdown_functions_mutex;
  Mutex::Lock(shutdown_functions_mutex);
  pvVar1 = shutdown_functions;
  __position._M_current = *(_func_void ***)(shutdown_functions + 8);
  if (__position._M_current == *(_func_void ***)(shutdown_functions + 0x10)) {
    std::vector<void(*)(),std::allocator<void(*)()>>::_M_realloc_insert<void(*const&)()>
              (shutdown_functions,__position,&local_30);
  }
  else {
    *__position._M_current = local_30;
    *(long *)(pvVar1 + 8) = *(long *)(pvVar1 + 8) + 8;
  }
  Mutex::Unlock(this);
  return;
}

Assistant:

void OnShutdown(void (*func)()) {
  InitShutdownFunctionsOnce();
  MutexLock lock(shutdown_functions_mutex);
  shutdown_functions->push_back(func);
}